

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void av1_quantize_b_facade
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,MACROBLOCK_PLANE *p,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,uint16_t *eob_ptr,SCAN_ORDER *sc,QUANT_PARAM *qparam)

{
  int iVar1;
  int16_t *quant_shift_ptr;
  long lVar2;
  tran_low_t *in_RCX;
  int16_t *in_RDX;
  tran_low_t *unaff_RBX;
  tran_low_t *unaff_RBP;
  tran_low_t *in_RSI;
  tran_low_t *in_RDI;
  tran_low_t *in_R8;
  uint16_t *in_R9;
  tran_low_t *unaff_R12;
  tran_low_t *unaff_R13;
  uint16_t *unaff_R14;
  tran_low_t *unaff_R15;
  int16_t *unaff_retaddr;
  uint16_t *in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int16_t *in_stack_00000018;
  qm_val_t *in_stack_00000020;
  qm_val_t *in_stack_00000028;
  int in_stack_00000030;
  qm_val_t *iqm_ptr;
  qm_val_t *qm_ptr;
  int16_t *in_stack_00000120;
  int16_t *in_stack_00000128;
  int16_t *in_stack_00000130;
  int16_t *in_stack_00000138;
  intptr_t in_stack_00000140;
  tran_low_t *in_stack_00000148;
  tran_low_t *in_stack_000007b0;
  tran_low_t *in_stack_000007b8;
  int16_t *in_stack_000007c0;
  uint16_t *in_stack_000007c8;
  int16_t *in_stack_000007d0;
  int16_t *in_stack_000007d8;
  
  quant_shift_ptr = *(int16_t **)(CONCAT44(in_stack_00000014,in_stack_00000010) + 8);
  lVar2 = *(long *)(CONCAT44(in_stack_00000014,in_stack_00000010) + 0x10);
  if (*(int *)(CONCAT44(in_stack_00000014,in_stack_00000010) + 0x18) == 0) {
    if ((quant_shift_ptr == (int16_t *)0x0) || (lVar2 == 0)) {
      iVar1 = *(int *)CONCAT44(in_stack_00000014,in_stack_00000010);
      if (iVar1 == 0) {
        (*aom_quantize_b)(in_RDI,(intptr_t)in_RSI,*(int16_t **)(in_RDX + 0x3c),
                          *(int16_t **)(in_RDX + 0x34),*(int16_t **)(in_RDX + 0x30),
                          *(int16_t **)(in_RDX + 0x38),in_RCX,in_R8,*(int16_t **)(in_RDX + 0x40),
                          in_R9,*(int16_t **)in_stack_00000008,*(int16_t **)(in_stack_00000008 + 4))
        ;
      }
      else if (iVar1 == 1) {
        (*aom_quantize_b_32x32)
                  (in_RDI,(intptr_t)in_RSI,*(int16_t **)(in_RDX + 0x3c),*(int16_t **)(in_RDX + 0x34)
                   ,*(int16_t **)(in_RDX + 0x30),*(int16_t **)(in_RDX + 0x38),in_RCX,in_R8,
                   *(int16_t **)(in_RDX + 0x40),in_R9,*(int16_t **)in_stack_00000008,
                   *(int16_t **)(in_stack_00000008 + 4));
      }
      else if (iVar1 == 2) {
        (*aom_quantize_b_64x64)
                  (in_RDI,(intptr_t)in_RSI,*(int16_t **)(in_RDX + 0x3c),*(int16_t **)(in_RDX + 0x34)
                   ,*(int16_t **)(in_RDX + 0x30),*(int16_t **)(in_RDX + 0x38),in_RCX,in_R8,
                   *(int16_t **)(in_RDX + 0x40),in_R9,*(int16_t **)in_stack_00000008,
                   *(int16_t **)(in_stack_00000008 + 4));
      }
    }
    else {
      aom_quantize_b_helper_c
                (in_RSI,(intptr_t)in_RDX,(int16_t *)in_RCX,(int16_t *)in_R8,(int16_t *)in_R9,
                 quant_shift_ptr,unaff_RBX,unaff_R12,(int16_t *)unaff_R13,unaff_R14,
                 (int16_t *)unaff_R15,(int16_t *)unaff_RBP,(qm_val_t *)unaff_retaddr,
                 (qm_val_t *)in_stack_00000008,in_stack_00000010);
    }
  }
  else if ((quant_shift_ptr == (int16_t *)0x0) || (lVar2 == 0)) {
    iVar1 = *(int *)CONCAT44(in_stack_00000014,in_stack_00000010);
    if (iVar1 == 0) {
      (*aom_quantize_b_adaptive)
                (in_RDI,(intptr_t)in_RSI,*(int16_t **)(in_RDX + 0x3c),*(int16_t **)(in_RDX + 0x34),
                 *(int16_t **)(in_RDX + 0x30),*(int16_t **)(in_RDX + 0x38),in_RCX,in_R8,
                 *(int16_t **)(in_RDX + 0x40),in_R9,*(int16_t **)in_stack_00000008,
                 *(int16_t **)(in_stack_00000008 + 4));
    }
    else if (iVar1 == 1) {
      aom_quantize_b_32x32_adaptive_sse2
                (in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
                 in_stack_00000128,in_stack_00000120,in_stack_000007b0,in_stack_000007b8,
                 in_stack_000007c0,in_stack_000007c8,in_stack_000007d0,in_stack_000007d8);
    }
    else if (iVar1 == 2) {
      aom_quantize_b_64x64_adaptive_sse2
                (in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
                 in_stack_00000128,in_stack_00000120,in_stack_000007b0,in_stack_000007b8,
                 in_stack_000007c0,in_stack_000007c8,in_stack_000007d0,in_stack_000007d8);
    }
  }
  else {
    aom_quantize_b_adaptive_helper_c
              (unaff_R13,(intptr_t)unaff_R12,(int16_t *)unaff_RBX,(int16_t *)in_RDI,
               (int16_t *)in_RSI,in_RDX,unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,
               (int16_t *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000018,
               in_stack_00000020,in_stack_00000028,in_stack_00000030);
  }
  return;
}

Assistant:

void av1_quantize_b_facade(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                           const MACROBLOCK_PLANE *p, tran_low_t *qcoeff_ptr,
                           tran_low_t *dqcoeff_ptr, uint16_t *eob_ptr,
                           const SCAN_ORDER *sc, const QUANT_PARAM *qparam) {
  const qm_val_t *qm_ptr = qparam->qmatrix;
  const qm_val_t *iqm_ptr = qparam->iqmatrix;
#if !CONFIG_REALTIME_ONLY
  if (qparam->use_quant_b_adapt) {
    // TODO(sarahparker) These quantize_b optimizations need SIMD
    // implementations
    if (qm_ptr != NULL && iqm_ptr != NULL) {
      aom_quantize_b_adaptive_helper_c(
          coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX, p->quant_QTX,
          p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX, eob_ptr,
          sc->scan, sc->iscan, qm_ptr, iqm_ptr, qparam->log_scale);
    } else {
      switch (qparam->log_scale) {
        case 0:
          aom_quantize_b_adaptive(coeff_ptr, n_coeffs, p->zbin_QTX,
                                  p->round_QTX, p->quant_QTX,
                                  p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr,
                                  p->dequant_QTX, eob_ptr, sc->scan, sc->iscan);
          break;
        case 1:
          aom_quantize_b_32x32_adaptive(
              coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX, p->quant_QTX,
              p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX,
              eob_ptr, sc->scan, sc->iscan);
          break;
        case 2:
          aom_quantize_b_64x64_adaptive(
              coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX, p->quant_QTX,
              p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX,
              eob_ptr, sc->scan, sc->iscan);
          break;
        default: assert(0);
      }
    }
    return;
  }
#endif  // !CONFIG_REALTIME_ONLY

  if (qm_ptr != NULL && iqm_ptr != NULL) {
    aom_quantize_b_helper_c(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX,
                            p->quant_QTX, p->quant_shift_QTX, qcoeff_ptr,
                            dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                            sc->iscan, qm_ptr, iqm_ptr, qparam->log_scale);
  } else {
    switch (qparam->log_scale) {
      case 0:
        aom_quantize_b(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX,
                       p->quant_QTX, p->quant_shift_QTX, qcoeff_ptr,
                       dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                       sc->iscan);
        break;
      case 1:
        aom_quantize_b_32x32(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX,
                             p->quant_QTX, p->quant_shift_QTX, qcoeff_ptr,
                             dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                             sc->iscan);
        break;
      case 2:
        aom_quantize_b_64x64(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX,
                             p->quant_QTX, p->quant_shift_QTX, qcoeff_ptr,
                             dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                             sc->iscan);
        break;
      default: assert(0);
    }
  }
}